

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O3

void Nf_ManPrintInit(Nf_Man_t *p)

{
  int *piVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  
  if (p->pPars->fVerbose != 0) {
    uVar4 = 0;
    printf("LutSize = %d  ",(ulong)(uint)p->pPars->nLutSize);
    printf("CutNum = %d  ",(ulong)(uint)p->pPars->nCutNum);
    printf("Iter = %d  ",(ulong)(uint)p->pPars->nRounds);
    printf("Coarse = %d   ",(ulong)(uint)p->pPars->fCoarsen);
    printf("Cells = %d  ",(ulong)(uint)p->nCells);
    printf("Funcs = %d  ");
    lVar2 = (long)p->vTt2Match->nSize;
    if (0 < lVar2) {
      lVar5 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + *(int *)((long)&p->vTt2Match->pArray->nSize + lVar5);
        lVar5 = lVar5 + 0x10;
      } while (lVar2 * 0x10 != lVar5);
      uVar4 = iVar3 / 2;
    }
    printf("Matches = %d  ",(ulong)uVar4);
    printf("And = %d  ");
    piVar1 = p->pGia->pSibls;
    if ((piVar1 != (int *)0x0) && (lVar2 = (long)p->pGia->nObjs, 0 < lVar2)) {
      lVar5 = 0;
      iVar3 = 0;
      do {
        iVar3 = iVar3 + (uint)(0 < piVar1[lVar5]);
        lVar5 = lVar5 + 1;
      } while (lVar2 != lVar5);
      if (iVar3 != 0) {
        printf("Choices = %d  ");
      }
    }
    putchar(10);
    printf("Computing cuts...\r");
    fflush(_stdout);
  }
  return;
}

Assistant:

void Nf_ManPrintInit( Nf_Man_t * p )
{
    int nChoices;
    if ( !p->pPars->fVerbose )
        return;
    printf( "LutSize = %d  ", p->pPars->nLutSize );
    printf( "CutNum = %d  ",  p->pPars->nCutNum );
    printf( "Iter = %d  ",    p->pPars->nRounds );//+ p->pPars->nRoundsEla );
    printf( "Coarse = %d   ", p->pPars->fCoarsen );
    printf( "Cells = %d  ",   p->nCells );
    printf( "Funcs = %d  ",   Vec_MemEntryNum(p->vTtMem) );
    printf( "Matches = %d  ", Vec_WecSizeSize(p->vTt2Match)/2 );
    printf( "And = %d  ",     Gia_ManAndNum(p->pGia) );
    nChoices = Gia_ManChoiceNum( p->pGia );
    if ( nChoices )
    printf( "Choices = %d  ", nChoices );
    printf( "\n" );
    printf( "Computing cuts...\r" );
    fflush( stdout );
}